

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O3

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  void *pvVar13;
  uint _h;
  int iVar14;
  long lVar15;
  void *pvVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint _c;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar24 [16];
  ulong local_60;
  
  uVar17 = this->output_width;
  _h = this->output_height;
  if (bottom_blob->dims == 1) {
    uVar21 = 1;
    uVar2 = 1;
    _c = bottom_blob->w;
  }
  else {
    uVar21 = bottom_blob->h;
    _c = bottom_blob->c;
    uVar2 = bottom_blob->w;
  }
  if (uVar17 == 0 || _h == 0) {
    _h = (uint)((float)(int)uVar21 * this->height_scale);
    uVar17 = (uint)((float)(int)uVar2 * this->width_scale);
  }
  if ((_h == uVar21) && (uVar17 == uVar2)) {
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 8))();
          }
        }
      }
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->allocator = bottom_blob->allocator;
      iVar18 = bottom_blob->w;
      iVar25 = bottom_blob->h;
      iVar14 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar18;
      top_blob->h = iVar25;
      top_blob->c = iVar14;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
  }
  else {
    Mat::create(top_blob,uVar17,_h,_c,bottom_blob->elemsize,opt->blob_allocator);
    auVar12 = _DAT_0013a4c0;
    auVar11 = _DAT_0013a4b0;
    auVar10 = _DAT_0013a440;
    pvVar16 = top_blob->data;
    if (pvVar16 == (void *)0x0) {
      return -100;
    }
    sVar5 = top_blob->cstep;
    if ((long)top_blob->c * sVar5 == 0) {
      return -100;
    }
    if (bottom_blob->dims == 1) {
      if (0 < (int)_c) {
        uVar17 = top_blob->h * top_blob->w;
        pvVar6 = bottom_blob->data;
        lVar15 = (ulong)uVar17 - 1;
        auVar22._8_4_ = (int)lVar15;
        auVar22._0_8_ = lVar15;
        auVar22._12_4_ = (int)((ulong)lVar15 >> 0x20);
        lVar15 = (long)pvVar16 + 0xc;
        sVar7 = top_blob->elemsize;
        uVar19 = 0;
        auVar22 = auVar22 ^ _DAT_0013a440;
        do {
          if (0 < (int)uVar17) {
            uVar1 = *(undefined4 *)((long)pvVar6 + uVar19 * 4);
            uVar20 = 0;
            do {
              auVar23._8_4_ = (int)uVar20;
              auVar23._0_8_ = uVar20;
              auVar23._12_4_ = (int)(uVar20 >> 0x20);
              auVar24 = (auVar23 | auVar12) ^ auVar10;
              iVar18 = auVar22._4_4_;
              if ((bool)(~(iVar18 < auVar24._4_4_ ||
                          auVar22._0_4_ < auVar24._0_4_ && auVar24._4_4_ == iVar18) & 1)) {
                *(undefined4 *)(lVar15 + -0xc + uVar20 * 4) = uVar1;
              }
              if (auVar24._12_4_ <= auVar22._12_4_ &&
                  (auVar24._8_4_ <= auVar22._8_4_ || auVar24._12_4_ != auVar22._12_4_)) {
                *(undefined4 *)(lVar15 + -8 + uVar20 * 4) = uVar1;
              }
              auVar23 = (auVar23 | auVar11) ^ auVar10;
              iVar25 = auVar23._4_4_;
              if (iVar25 <= iVar18 && (iVar25 != iVar18 || auVar23._0_4_ <= auVar22._0_4_)) {
                *(undefined4 *)(lVar15 + -4 + uVar20 * 4) = uVar1;
                *(undefined4 *)(lVar15 + uVar20 * 4) = uVar1;
              }
              uVar20 = uVar20 + 4;
            } while ((uVar17 + 3 & 0xfffffffc) != uVar20);
          }
          uVar19 = uVar19 + 1;
          lVar15 = lVar15 + sVar5 * sVar7;
        } while (uVar19 != _c);
      }
    }
    else {
      uVar3 = this->resize_type;
      if (uVar3 == 2) {
        resize_bilinear(bottom_blob,top_blob,uVar17,_h,(Allocator *)0x0,1);
        return 0;
      }
      if (uVar3 != 1) {
        fprintf(_stderr,"unsupported resize type %d %d %d\n",(ulong)uVar3,(ulong)_h,(ulong)uVar17);
        return -0xe9;
      }
      if (0 < (int)_c) {
        pvVar6 = bottom_blob->data;
        sVar7 = bottom_blob->cstep;
        sVar8 = bottom_blob->elemsize;
        sVar9 = top_blob->elemsize;
        local_60 = 0;
        do {
          if (0 < (int)_h) {
            uVar19 = 0;
            pvVar13 = pvVar16;
            do {
              if (0 < (int)uVar17) {
                iVar18 = (int)((float)(int)uVar19 / this->height_scale);
                if ((int)(uVar21 - 1) < iVar18) {
                  iVar18 = uVar21 - 1;
                }
                uVar20 = 0;
                do {
                  iVar14 = (int)((float)(int)uVar20 / this->width_scale);
                  iVar25 = uVar2 - 1;
                  if (iVar14 <= (int)(uVar2 - 1)) {
                    iVar25 = iVar14;
                  }
                  *(undefined4 *)((long)pvVar13 + uVar20 * 4) =
                       *(undefined4 *)
                        ((long)pvVar6 +
                        (long)(int)(iVar25 + iVar18 * uVar2) * 4 + sVar7 * sVar8 * local_60);
                  uVar20 = uVar20 + 1;
                } while (uVar17 != uVar20);
              }
              uVar19 = uVar19 + 1;
              pvVar13 = (void *)((long)pvVar13 + (ulong)uVar17 * 4);
            } while (uVar19 != _h);
          }
          local_60 = local_60 + 1;
          pvVar16 = (void *)((long)pvVar16 + sVar5 * sVar9);
        } while (local_60 != _c);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)//nearest
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        resize_bilinear(bottom_blob, top_blob, ow, oh);
        return 0;

    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}